

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim.c
# Opt level: O0

double aom_highbd_ssim2(uint8_t *img1,uint8_t *img2,int stride_img1,int stride_img2,int width,
                       int height,uint32_t bd,uint32_t shift)

{
  uint32_t in_ECX;
  int in_EDX;
  uint16_t *in_RSI;
  long in_RDI;
  uint32_t in_R8D;
  int in_R9D;
  double dVar1;
  uint16_t *unaff_retaddr;
  double v;
  double ssim_total;
  int samples;
  int j;
  int i;
  undefined8 local_38;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  
  local_2c = 0;
  local_38 = 0.0;
  for (local_24 = 0; local_24 <= in_R9D + -8; local_24 = local_24 + 4) {
    for (local_28 = 0; local_28 <= (int)(in_R8D - 8); local_28 = local_28 + 4) {
      dVar1 = highbd_ssim_8x8(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),in_RSI,in_EDX,in_ECX,in_R8D
                             );
      local_38 = dVar1 + local_38;
      local_2c = local_2c + 1;
    }
    in_RDI = in_RDI + (in_EDX << 2);
    in_RSI = (uint16_t *)((long)in_RSI + (long)(int)(in_ECX << 2));
  }
  return local_38 / (double)local_2c;
}

Assistant:

double aom_highbd_ssim2(const uint8_t *img1, const uint8_t *img2,
                        int stride_img1, int stride_img2, int width, int height,
                        uint32_t bd, uint32_t shift) {
  int i, j;
  int samples = 0;
  double ssim_total = 0;

  // sample point start with each 4x4 location
  for (i = 0; i <= height - 8;
       i += 4, img1 += stride_img1 * 4, img2 += stride_img2 * 4) {
    for (j = 0; j <= width - 8; j += 4) {
      double v = highbd_ssim_8x8(CONVERT_TO_SHORTPTR(img1 + j), stride_img1,
                                 CONVERT_TO_SHORTPTR(img2 + j), stride_img2, bd,
                                 shift);
      ssim_total += v;
      samples++;
    }
  }
  ssim_total /= samples;
  return ssim_total;
}